

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * __thiscall
CGL::Matrix3x3::operator-(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  int i;
  long lVar1;
  double *pdVar2;
  long lVar3;
  
  Matrix3x3(__return_storage_ptr__);
  pdVar2 = (double *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
      *(double *)((long)pdVar2 + lVar3) =
           *(double *)((long)this + lVar3) - *(double *)((long)B + lVar3);
    }
    this = (Matrix3x3 *)((long)this + 8);
    B = (Matrix3x3 *)((long)B + 8);
    pdVar2 = pdVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator-( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = A(i,j) - B(i,j);
    }

    return C;
  }